

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeHulls.cpp
# Opt level: O3

HaU32 __thiscall
HACD::MyMergeHullsInterface::mergeHulls
          (MyMergeHullsInterface *this,MergeHullVector *inputHulls,MergeHullVector *outputHulls,
          HaU32 mergeHullCount,HaF32 smallClusterThreshold,HaU32 maxHullVertices)

{
  HaF32 **ppHVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  HaU32 HVar4;
  HaU32 tcount;
  HaU32 vcount;
  MergeHull *pMVar5;
  HaF32 *pHVar6;
  HaU32 *pHVar7;
  MergeHull *pMVar8;
  undefined1 auVar9 [32];
  undefined8 uVar10;
  bool bVar11;
  TestedMap *pTVar12;
  HashEntry *pHVar13;
  ChUll *pCVar14;
  uint uVar15;
  ulong uVar16;
  char *__function;
  long lVar17;
  HashEntry *pHVar18;
  uint uVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  
  this->mGuid = 0;
  HVar4 = inputHulls->mSize;
  pTVar12 = (TestedMap *)malloc(0x1018);
  uVar19 = HVar4 * HVar4;
  memset(pTVar12,0,0x100c);
  pTVar12->mMaxEntries = uVar19;
  pHVar13 = (HashEntry *)malloc((ulong)uVar19 << 4);
  if (uVar19 != 0) {
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar9 = vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    uVar16 = (ulong)uVar19 + 0xfffffffffffffff;
    auVar21 = vpbroadcastq_avx512f();
    lVar17 = 0;
    pHVar18 = pHVar13;
    do {
      auVar22 = vpbroadcastq_avx512f();
      lVar17 = lVar17 + 8;
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar10 = vpcmpuq_avx512f(auVar22,auVar21,2);
      vpscatterdq_avx512f(ZEXT864(pHVar18) + ZEXT3264(auVar9),uVar10,ZEXT1664((undefined1  [16])0x0)
                         );
      pHVar18 = pHVar18 + 8;
    } while (((uVar16 & 0xfffffffffffffff) + 8) - (ulong)((uint)uVar16 & 7) != lVar17);
  }
  pTVar12->mEntries = pHVar13;
  this->mHasBeenTested = pTVar12;
  this->mSmallClusterThreshold = smallClusterThreshold;
  this->mMaxHullVertices = maxHullVertices;
  this->mMergeNumHulls = mergeHullCount;
  this->mTotalVolume = 0.0;
  if (HVar4 != 0) {
    lVar17 = 0x10;
    uVar16 = 0;
    do {
      pMVar5 = inputHulls->mData;
      pCVar14 = (ChUll *)malloc(0x40);
      HVar4 = this->mGuid;
      pHVar6 = *(HaF32 **)((long)pMVar5 + lVar17 + -8);
      tcount = *(HaU32 *)((long)pMVar5 + lVar17 + -0x10);
      vcount = *(HaU32 *)((long)pMVar5 + lVar17 + -0xc);
      pHVar7 = *(HaU32 **)((long)&pMVar5->mTriangleCount + lVar17);
      this->mGuid = HVar4 + 1;
      ChUll::ChUll(pCVar14,vcount,pHVar6,tcount,pHVar7,HVar4);
      uVar15 = (this->mChulls).mCapacity & 0x7fffffff;
      uVar19 = (this->mChulls).mSize;
      if (uVar15 <= uVar19) {
        uVar19 = uVar15 * 2;
        if (uVar15 == 0) {
          uVar19 = 1;
        }
        if (uVar19 <= uVar15) {
          __function = "void hacd::vector<HACD::ChUll *>::grow(HaU32) [T = HACD::ChUll *]";
          goto LAB_0086c68b;
        }
        hacd::vector<HACD::ChUll_*>::recreate(&this->mChulls,uVar19);
        uVar19 = (this->mChulls).mSize;
      }
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 0x18;
      (this->mChulls).mData[uVar19] = pCVar14;
      (this->mChulls).mSize = uVar19 + 1;
      this->mTotalVolume = (HaF32)((float)pCVar14->mVolume + (float)this->mTotalVolume);
    } while (uVar16 < inputHulls->mSize);
  }
  do {
    bVar11 = combineHulls(this);
  } while (bVar11);
  if ((this->mChulls).mSize != 0) {
    uVar19 = outputHulls->mSize;
    uVar16 = 0;
    do {
      pCVar14 = (this->mChulls).mData[uVar16];
      uVar2 = pCVar14->mVertexCount;
      uVar3 = pCVar14->mTriangleCount;
      auVar23._4_4_ = uVar3;
      auVar23._0_4_ = uVar2;
      auVar23._8_8_ = 0;
      pHVar6 = pCVar14->mVertices;
      pHVar7 = pCVar14->mIndices;
      uVar15 = outputHulls->mCapacity & 0x7fffffff;
      if (uVar15 <= uVar19) {
        uVar19 = uVar15 * 2;
        if (uVar15 == 0) {
          uVar19 = 1;
        }
        if (uVar19 <= uVar15) {
          __function = "void hacd::vector<HACD::MergeHull>::grow(HaU32) [T = HACD::MergeHull]";
LAB_0086c68b:
          __assert_fail("this->capacity() < capacity",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                        ,0x208,__function);
        }
        hacd::vector<HACD::MergeHull>::recreate(outputHulls,uVar19);
        uVar19 = outputHulls->mSize;
      }
      pMVar8 = outputHulls->mData;
      auVar23 = vshufps_avx(auVar23,auVar23,0xe1);
      uVar16 = uVar16 + 1;
      pMVar5 = pMVar8 + uVar19;
      uVar10 = vmovlps_avx(auVar23);
      pMVar5->mTriangleCount = (int)uVar10;
      pMVar5->mVertexCount = (int)((ulong)uVar10 >> 0x20);
      ppHVar1 = &pMVar8[uVar19].mVertices;
      *ppHVar1 = pHVar6;
      ppHVar1[1] = (HaF32 *)pHVar7;
      uVar19 = outputHulls->mSize + 1;
      outputHulls->mSize = uVar19;
    } while (uVar16 < (this->mChulls).mSize);
  }
  pTVar12 = this->mHasBeenTested;
  if (pTVar12 != (TestedMap *)0x0) {
    if (pTVar12->mEntries != (HashEntry *)0x0) {
      free(pTVar12->mEntries);
    }
    free(pTVar12);
  }
  return outputHulls->mSize;
}

Assistant:

virtual hacd::HaU32 mergeHulls(const MergeHullVector &inputHulls,
		MergeHullVector &outputHulls,
		hacd::HaU32 mergeHullCount,
		hacd::HaF32 smallClusterThreshold,
		hacd::HaU32 maxHullVertices)
	{
		mGuid = 0;

		HaU32 count = (HaU32)inputHulls.size();
		mHasBeenTested = HACD_NEW(TestedMap)(count*count);
		mSmallClusterThreshold = smallClusterThreshold;
		mMaxHullVertices = maxHullVertices;
		mMergeNumHulls = mergeHullCount;

		mTotalVolume = 0;
		for (HaU32 i=0; i<inputHulls.size(); i++)
		{
			const MergeHull &h = inputHulls[i];
			ChUll *ch = HACD_NEW(ChUll)(h.mVertexCount,h.mVertices,h.mTriangleCount,h.mIndices,mGuid++);
			mChulls.push_back(ch);
			mTotalVolume+=ch->mVolume;
		}

		for(;;)
		{
			bool combined = combineHulls(); // mege smallest hulls first, up to the max merge count.
			if ( !combined ) break;
		} 

		// return results..
		for (HaU32 i=0; i<mChulls.size(); i++)
		{
			ChUll *ch = mChulls[i];
			MergeHull mh;
			mh.mVertexCount = ch->mVertexCount;
			mh.mTriangleCount = ch->mTriangleCount;
			mh.mIndices = ch->mIndices;
			mh.mVertices = ch->mVertices;
			outputHulls.push_back(mh);
		}
		delete mHasBeenTested;
		return (HaU32)outputHulls.size();
	}